

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot_histogram_of_intervals_lengths.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  uint dimension;
  size_t where_to_cut;
  size_t i;
  long lVar4;
  char *local_420 [4];
  vector<unsigned_long,_std::allocator<unsigned_long>_> histogram;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> dominant_intervals;
  Persistence_intervals p;
  ofstream out;
  stringstream gnuplot_script;
  ostream local_198 [376];
  
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "This program computes a histogram of barcode\'s length. A number of bins in the histogram is a "
                          );
  std::operator<<(poVar3,"parameter of this program. \n");
  if (argc - 5U < 0xfffffffe) {
    poVar3 = std::operator<<((ostream *)&std::clog,
                             "To run this program, please provide the name of a file with persistence diagram and number of "
                            );
    poVar3 = std::operator<<(poVar3,
                             "dominant intervals you would like to get. Set a negative number dominant intervals value "
                            );
    poVar3 = std::operator<<(poVar3,"If your file contains only birth-death pairs.\n");
    poVar3 = std::operator<<(poVar3,
                             "The third parameter is the dimension of the persistence that is to be used. If your "
                            );
    std::operator<<(poVar3,"file contains only birth-death pairs, you can skip this parameter\n");
    iVar2 = 1;
  }
  else {
    uVar1 = atoi(argv[2]);
    dimension = 0xffffffff;
    if (-1 < (int)uVar1) {
      dimension = uVar1;
    }
    if (argc == 4) {
      iVar2 = atoi(argv[3]);
      where_to_cut = (size_t)iVar2;
    }
    else {
      where_to_cut = 0xffffffffffffffff;
    }
    Gudhi::Persistence_representations::Persistence_intervals::Persistence_intervals
              (&p,argv[1],dimension);
    Gudhi::Persistence_representations::Persistence_intervals::dominant_intervals
              (&dominant_intervals,&p,where_to_cut);
    Gudhi::Persistence_representations::Persistence_intervals::histogram_of_lengths
              (&histogram,&p,10);
    std::__cxx11::stringstream::stringstream((stringstream *)&gnuplot_script);
    poVar3 = std::operator<<(local_198,argv[1]);
    std::operator<<(poVar3,"_GnuplotScript");
    std::ofstream::ofstream(&out);
    std::__cxx11::stringbuf::str();
    std::ofstream::open((char *)&out,(_Ios_Openmode)local_420[0]);
    std::__cxx11::string::~string((string *)local_420);
    poVar3 = std::operator<<((ostream *)&out,"set style data histogram");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&out,"set style histogram cluster gap 1");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&out,"set style fill solid border -1");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&out,"plot \'-\' notitle");
    std::endl<char,std::char_traits<char>>(poVar3);
    for (lVar4 = 0;
        lVar4 != (long)histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3; lVar4 = lVar4 + 1) {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&out);
    std::ofstream::close();
    poVar3 = std::operator<<((ostream *)&std::clog,
                             "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'"
                            );
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(poVar3,local_420[0]);
    poVar3 = std::operator<<(poVar3,"\'\"");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)local_420);
    std::ofstream::~ofstream(&out);
    std::__cxx11::stringstream::~stringstream((stringstream *)&gnuplot_script);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
    ~_Vector_base(&dominant_intervals.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 );
    std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
    ~_Vector_base((_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   *)&p);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program computes a histogram of barcode's length. A number of bins in the histogram is a "
            << "parameter of this program. \n";
  if ((argc != 3) && (argc != 4)) {
    std::clog << "To run this program, please provide the name of a file with persistence diagram and number of "
              << "dominant intervals you would like to get. Set a negative number dominant intervals value "
              << "If your file contains only birth-death pairs.\n"
              << "The third parameter is the dimension of the persistence that is to be used. If your "
              << "file contains only birth-death pairs, you can skip this parameter\n";
    return 1;
  }

  unsigned dominant_interval_number = std::numeric_limits<unsigned>::max();
  int nbr = atoi(argv[2]);
  if (nbr >= 0) {
    dominant_interval_number = static_cast<unsigned>(nbr);
  }

  int persistence_dimension = -1;
  if (argc == 4) {
    persistence_dimension = atoi(argv[3]);
  }

  Persistence_intervals p(argv[1], dominant_interval_number);
  std::vector<std::pair<double, double> > dominant_intervals = p.dominant_intervals(persistence_dimension);
  std::vector<size_t> histogram = p.histogram_of_lengths(10);

  std::stringstream gnuplot_script;
  gnuplot_script << argv[1] << "_GnuplotScript";
  std::ofstream out;
  out.open(gnuplot_script.str().c_str());

  out << "set style data histogram" << std::endl;
  out << "set style histogram cluster gap 1" << std::endl;
  out << "set style fill solid border -1" << std::endl;
  out << "plot '-' notitle" << std::endl;
  for (size_t i = 0; i != histogram.size(); ++i) {
    out << histogram[i] << std::endl;
  }
  out << std::endl;
  out.close();

  std::clog << "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'"
            << gnuplot_script.str().c_str() << "\'\"" << std::endl;
  return 0;
}